

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O3

float __thiscall Rml::Box::GetCumulativeEdge(Box *this,BoxArea area,BoxEdge edge)

{
  code *pcVar1;
  bool bVar2;
  BoxArea BVar3;
  long lVar4;
  float fVar5;
  
  if (area == Auto) {
    bVar2 = Assert("RMLUI_ASSERT(area != BoxArea::Auto)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                   ,0x59);
    BVar3 = Padding;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    BVar3 = Padding;
    if ((int)area < 2) {
      BVar3 = area;
    }
    if ((int)area < 0) {
      return 0.0;
    }
  }
  fVar5 = 0.0;
  lVar4 = 0;
  do {
    fVar5 = fVar5 + *(float *)((long)this->area_edges[0] + lVar4 + (long)(int)edge * 4);
    lVar4 = lVar4 + 0x10;
  } while ((ulong)BVar3 * 0x10 + 0x10 != lVar4);
  return fVar5;
}

Assistant:

float Box::GetCumulativeEdge(BoxArea area, BoxEdge edge) const
{
	RMLUI_ASSERT(area != BoxArea::Auto);
	float size = 0;
	int max_area = Math::Min((int)area, (int)BoxArea::Padding);
	for (int i = 0; i <= max_area; i++)
		size += area_edges[i][(int)edge];

	return size;
}